

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O2

slReturn actionSaveConfig(optionDef_slOptions *defs,psloConfig *config)

{
  errInfo error;
  _Bool _Var1;
  slReturn pvVar2;
  char *msg;
  errorInfo_slReturn local_50;
  errorInfo_slReturn local_30;
  
  pvVar2 = syncSerial(syncUBX,config->clientData);
  _Var1 = isErrorReturn(pvVar2);
  if (_Var1) {
    createErrorInfo(&local_30,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                    ,"actionSaveConfig",0x3fa,pvVar2);
    msg = "could not synchronize UBX protocol";
  }
  else {
    pvVar2 = ubxSaveConfig(config->clientData->fdPort,config->clientData->verbosity);
    _Var1 = isErrorReturn(pvVar2);
    if (!_Var1) {
      pvVar2 = makeOkReturn();
      return pvVar2;
    }
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                    ,"actionSaveConfig",0x3ff,pvVar2);
    msg = "problem saving GPS configuration";
    local_30.cause = local_50.cause;
    local_30.fileName = local_50.fileName;
    local_30.functionName = local_50.functionName;
    local_30._24_8_ = local_50._24_8_;
  }
  error.fileName = local_30.fileName;
  error.cause = local_30.cause;
  error.functionName = local_30.functionName;
  error.lineNumber = local_30.lineNumber;
  error._28_4_ = local_30._28_4_;
  pvVar2 = makeErrorMsgReturn(error,msg);
  return pvVar2;
}

Assistant:

static slReturn  actionSaveConfig(const optionDef_slOptions* defs, const psloConfig* config) {

    // make sure we're synchronized...
    clientData_slOptions* clientData = config->clientData;
    slReturn usResp = syncSerial(syncUBX, clientData);
    if (isErrorReturn(usResp))
        return makeErrorMsgReturn(ERR_CAUSE(usResp), "could not synchronize UBX protocol");

    // save the GPS configuration...
    slReturn uscResp = ubxSaveConfig(config->clientData->fdPort, config->clientData->verbosity);
    if (isErrorReturn(uscResp))
        return makeErrorMsgReturn(ERR_CAUSE(uscResp), "problem saving GPS configuration");

    return makeOkReturn();
}